

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_6_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_488;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_344;
  float local_338;
  float fStack_31c;
  float fStack_310;
  float fStack_304;
  float local_2f8;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  
  decode = output_buffer;
  pfStack_488 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (int)*horizontal_coefficients_local * 7;
    local_2f8 = (float)*(undefined8 *)pfStack_488;
    local_188 = (float)*(undefined8 *)pfVar1;
    fStack_184 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_17c = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    local_1a8 = (float)*(undefined8 *)(pfVar1 + 3);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 3) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfVar1 + 5);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfVar1 + 5) >> 0x20);
    fStack_304 = (float)((ulong)*(undefined8 *)pfStack_488 >> 0x20);
    local_1c8 = (float)*(undefined8 *)(pfVar1 + 7);
    fStack_1c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 7) >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)(pfVar1 + 9);
    fStack_1bc = (float)((ulong)*(undefined8 *)(pfVar1 + 9) >> 0x20);
    local_1e8 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_1e4 = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_1e0 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_1dc = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_310 = (float)*(undefined8 *)(pfStack_488 + 2);
    local_208 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_204 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    fStack_200 = (float)*(undefined8 *)(pfVar1 + 0x10);
    fStack_1fc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x10) >> 0x20);
    local_228 = (float)*(undefined8 *)(pfVar1 + 0x11);
    fStack_224 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x11) >> 0x20);
    fStack_220 = (float)*(undefined8 *)(pfVar1 + 0x13);
    fStack_21c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x13) >> 0x20);
    fStack_31c = (float)((ulong)*(undefined8 *)(pfStack_488 + 2) >> 0x20);
    local_248 = (float)*(undefined8 *)(pfVar1 + 0x15);
    fStack_244 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x15) >> 0x20);
    fStack_240 = (float)*(undefined8 *)(pfVar1 + 0x17);
    fStack_23c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x17) >> 0x20);
    local_268 = (float)*(undefined8 *)(pfVar1 + 0x18);
    fStack_264 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x18) >> 0x20);
    fStack_260 = (float)*(undefined8 *)(pfVar1 + 0x1a);
    fStack_25c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1a) >> 0x20);
    local_338 = (float)*(undefined8 *)(pfStack_488 + 4);
    local_288 = (float)*(undefined8 *)(pfVar1 + 0x1c);
    fStack_284 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1c) >> 0x20);
    fStack_280 = (float)*(undefined8 *)(pfVar1 + 0x1e);
    fStack_27c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1e) >> 0x20);
    local_2a8 = (float)*(undefined8 *)(pfVar1 + 0x1f);
    fStack_2a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1f) >> 0x20);
    fStack_2a0 = (float)*(undefined8 *)(pfVar1 + 0x21);
    fStack_29c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x21) >> 0x20);
    fStack_344 = (float)((ulong)*(undefined8 *)(pfStack_488 + 4) >> 0x20);
    local_2c8 = (float)*(undefined8 *)(pfVar1 + 0x23);
    fStack_2c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x23) >> 0x20);
    fStack_2c0 = (float)*(undefined8 *)(pfVar1 + 0x25);
    fStack_2bc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x25) >> 0x20);
    local_2e8 = (float)*(undefined8 *)(pfVar1 + 0x26);
    fStack_2e4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x26) >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)(pfVar1 + 0x28);
    fStack_2dc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x28) >> 0x20);
    *(ulong *)(decode + 3) =
         CONCAT44(local_2f8 * fStack_1a4 + fStack_310 * fStack_224 + local_338 * fStack_2a4 +
                  fStack_304 * fStack_1e4 + fStack_31c * fStack_264 + fStack_344 * fStack_2e4,
                  local_2f8 * local_1a8 + fStack_310 * local_228 + local_338 * local_2a8 +
                  fStack_304 * local_1e8 + fStack_31c * local_268 + fStack_344 * local_2e8);
    *(ulong *)(decode + 5) =
         CONCAT44(local_2f8 * fStack_19c + fStack_310 * fStack_21c + local_338 * fStack_29c +
                  fStack_304 * fStack_1dc + fStack_31c * fStack_25c + fStack_344 * fStack_2dc,
                  local_2f8 * fStack_1a0 + fStack_310 * fStack_220 + local_338 * fStack_2a0 +
                  fStack_304 * fStack_1e0 + fStack_31c * fStack_260 + fStack_344 * fStack_2e0);
    *(ulong *)decode =
         CONCAT44(local_2f8 * fStack_184 + fStack_310 * fStack_204 + local_338 * fStack_284 +
                  fStack_304 * fStack_1c4 + fStack_31c * fStack_244 + fStack_344 * fStack_2c4,
                  local_2f8 * local_188 + fStack_310 * local_208 + local_338 * local_288 +
                  fStack_304 * local_1c8 + fStack_31c * local_248 + fStack_344 * local_2c8);
    *(ulong *)(decode + 2) =
         CONCAT44(local_2f8 * fStack_17c + fStack_310 * fStack_1fc + local_338 * fStack_27c +
                  fStack_304 * fStack_1bc + fStack_31c * fStack_23c + fStack_344 * fStack_2bc,
                  local_2f8 * fStack_180 + fStack_310 * fStack_200 + local_338 * fStack_280 +
                  fStack_304 * fStack_1c0 + fStack_31c * fStack_240 + fStack_344 * fStack_2c0);
    pfStack_488 = pfStack_488 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 7;
  } while (decode < output_buffer + output_sub_size * 7);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_6_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__2_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}